

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateSource
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  FieldGeneratorMap *this_00;
  uint uVar1;
  int32 key;
  pointer ppEVar2;
  pointer ppEVar3;
  bool include_default;
  bool bVar4;
  int iVar5;
  FieldGenerator *pFVar6;
  FieldDescriptor **ppFVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  int i_00;
  FieldDescriptor **ppFVar10;
  unsigned_long i_01;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  undefined8 extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *pDVar12;
  int i_1;
  ulong uVar13;
  pointer ppOVar14;
  Descriptor *descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int i;
  long lVar15;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  pointer ppEVar16;
  int i_2;
  long lVar17;
  pointer ppEVar18;
  pointer ppMVar19;
  string suffix_added;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  scoped_array<const_google::protobuf::FieldDescriptor_*> size_order_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  init_flags;
  TextFormatDecodeData text_format_decode_data;
  key_type local_b0;
  string field_description_type;
  string local_70;
  string local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\0') {
    value = &this->class_name_;
    io::Printer::Print(printer,"#pragma mark - $classname$\n\n","classname",value);
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print(printer,
                         "#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n\n"
                        );
    }
    io::Printer::Print(printer,"@implementation $classname$\n\n","classname",value);
    for (ppOVar14 = (this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppOVar14 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppOVar14 = ppOVar14 + 1) {
      OneofGenerator::GeneratePropertyImplementation(*ppOVar14,printer);
    }
    this_00 = &this->field_generators_;
    lVar17 = 0;
    for (lVar15 = 0; pDVar12 = this->descriptor_, lVar15 < *(int *)(pDVar12 + 0x2c);
        lVar15 = lVar15 + 1) {
      pFVar6 = FieldGeneratorMap::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar12 + 0x30) + lVar17));
      (*pFVar6->_vptr_FieldGenerator[4])(pFVar6,printer);
      lVar17 = lVar17 + 0xa8;
    }
    sorted_fields.array_ = anon_unknown_7::SortFieldsByNumber(pDVar12);
    pDVar12 = this->descriptor_;
    uVar1 = *(uint *)(pDVar12 + 0x2c);
    uVar13 = (ulong)(int)uVar1;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (long)uVar13) {
      uVar9 = uVar13 * 8;
    }
    ppFVar7 = (FieldDescriptor **)operator_new__(uVar9);
    lVar15 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    ppFVar10 = ppFVar7;
    for (; uVar9 * 0xa8 - lVar15 != 0; lVar15 = lVar15 + 0xa8) {
      *ppFVar10 = (FieldDescriptor *)(*(long *)(pDVar12 + 0x30) + lVar15);
      ppFVar10 = ppFVar10 + 1;
    }
    if (uVar1 != 0) {
      lVar15 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<google::protobuf::FieldDescriptor_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                (ppFVar7,ppFVar7 + uVar13,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if ((int)uVar1 < 0x11) {
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (ppFVar7,ppFVar7 + uVar13);
      }
      else {
        ppFVar10 = ppFVar7 + 0x10;
        std::
        __insertion_sort<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                  (ppFVar7,ppFVar10);
        for (lVar15 = uVar13 * 8 + -0x80; lVar15 != 0; lVar15 = lVar15 + -8) {
          std::
          __unguarded_linear_insert<google::protobuf::FieldDescriptor_const**,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::FieldOrderingByStorageSize>>
                    (ppFVar10);
          ppFVar10 = ppFVar10 + 1;
        }
      }
    }
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sorted_extensions.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar17 = 0;
    size_order_fields.array_ = ppFVar7;
    for (lVar15 = 0;
        ppEVar3 = sorted_extensions.
                  super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        ppEVar2 = sorted_extensions.
                  super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar15 < *(int *)(this->descriptor_ + 0x68); lVar15 = lVar15 + 1) {
      vars._M_t._M_impl._0_8_ = *(long *)(this->descriptor_ + 0x70) + lVar17;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)&sorted_extensions,(ExtensionRange **)&vars);
      lVar17 = lVar17 + 8;
    }
    if (sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar17 = (long)sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = lVar17 >> 3;
      lVar15 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                (sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 sorted_extensions.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar17 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar2,ppEVar3);
      }
      else {
        ppEVar16 = ppEVar2 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                  (ppEVar2,ppEVar16);
        for (; ppEVar16 != ppEVar3; ppEVar16 = ppEVar16 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::objectivec::(anonymous_namespace)::ExtensionRangeOrdering>>
                    (ppEVar16);
        }
      }
    }
    iVar5 = FieldGeneratorMap::CalculateHasBits(this_00);
    uVar9 = 1;
    if (0x1f < (long)iVar5 + 0x1fU) {
      uVar9 = (long)iVar5 + 0x1fU >> 5;
    }
    for (ppOVar14 = (this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppOVar14 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppOVar14 = ppOVar14 + 1) {
      OneofGenerator::SetOneofIndexBase(*ppOVar14,(int)uVar9);
    }
    FieldGeneratorMap::SetOneofIndexBase(this_00,(int)uVar9);
    SimpleItoa_abi_cxx11_
              ((string *)&vars,(protobuf *)(uVar9 + (long)*(int *)(this->descriptor_ + 0x38)),i_01);
    io::Printer::Print(printer,
                       "\ntypedef struct $classname$__storage_ {\n  uint32_t _has_storage_[$sizeof_has_storage$];\n"
                       ,"classname",value,"sizeof_has_storage",(string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
    io::Printer::Indent(printer);
    for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x2c); lVar15 = lVar15 + 1) {
      ppFVar7 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&size_order_fields,lVar15);
      pFVar6 = FieldGeneratorMap::get(this_00,*ppFVar7);
      (*pFVar6->_vptr_FieldGenerator[2])(pFVar6,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"} $classname$__storage_;\n\n","classname",value);
    io::Printer::Print(printer,
                       "// This method is threadsafe because it is initially called\n// in +initialize for each subclass.\n+ (GPBDescriptor *)descriptor {\n  static GPBDescriptor *descriptor = nil;\n  if (!descriptor) {\n"
                      );
    TextFormatDecodeData::TextFormatDecodeData(&text_format_decode_data);
    iVar5 = *(int *)(this->descriptor_ + 0x2c);
    include_default = FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(this_00);
    field_description_type._M_dataplus._M_p = (pointer)&field_description_type.field_2;
    field_description_type._M_string_length = 0;
    field_description_type.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&field_description_type);
    if (0 < iVar5) {
      io::Printer::Print(printer,"    static $field_description_type$ fields[] = {\n",
                         "field_description_type",&field_description_type);
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      io::Printer::Indent(printer);
      for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x2c); lVar15 = lVar15 + 1) {
        ppFVar7 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&sorted_fields,lVar15);
        pFVar6 = FieldGeneratorMap::get(this_00,*ppFVar7);
        FieldGenerator::GenerateFieldDescription(pFVar6,printer,include_default);
        bVar4 = FieldGenerator::needs_textformat_name_support(pFVar6);
        if (bVar4) {
          ppFVar7 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              (&sorted_fields,lVar15);
          key = *(int32 *)(*ppFVar7 + 0x38);
          FieldGenerator::generated_objc_name_abi_cxx11_((string *)&vars,pFVar6);
          FieldGenerator::raw_field_name_abi_cxx11_(&suffix_added,pFVar6);
          TextFormatDecodeData::AddString
                    (&text_format_decode_data,key,(string *)&vars,&suffix_added);
          std::__cxx11::string::~string((string *)&suffix_added);
          std::__cxx11::string::~string((string *)&vars);
        }
      }
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"    };\n");
    }
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suffix_added,"classname",(allocator<char> *)&local_168);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&suffix_added);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    std::__cxx11::string::~string((string *)&suffix_added);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suffix_added,"rootclassname",(allocator<char> *)&local_168);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&suffix_added);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    std::__cxx11::string::~string((string *)&suffix_added);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suffix_added,"fields",(allocator<char> *)&local_168);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&suffix_added);
    std::__cxx11::string::assign((char *)pmVar8);
    std::__cxx11::string::~string((string *)&suffix_added);
    if (iVar5 < 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix_added,"fields_count",(allocator<char> *)&local_168);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&suffix_added);
      std::__cxx11::string::assign((char *)pmVar8);
      this_01 = &suffix_added;
    }
    else {
      std::operator+(&local_168,"(uint32_t)(sizeof(fields) / sizeof(",&field_description_type);
      std::operator+(&suffix_added,&local_168,"))");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"fields_count",(allocator<char> *)&local_70);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_b0);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&suffix_added);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&suffix_added);
      this_01 = &local_168;
    }
    std::__cxx11::string::~string((string *)this_01);
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    init_flags.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (include_default) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix_added,"GPBDescriptorInitializationFlag_FieldsWithDefault",
                 (allocator<char> *)&local_168);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
                 &suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
    }
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix_added,"GPBDescriptorInitializationFlag_WireFormat",
                 (allocator<char> *)&local_168);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&init_flags,
                 &suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
    }
    BuildFlagsString(&suffix_added,FLAGTYPE_DESCRIPTOR_INITIALIZATION,&init_flags);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"init_flags",(allocator<char> *)&local_b0);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_168);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&suffix_added);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&suffix_added);
    io::Printer::Print(printer,&vars,
                       "    GPBDescriptor *localDescriptor =\n        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n                                     rootClass:[$rootclassname$ class]\n                                          file:$rootclassname$_FileDescriptor()\n                                        fields:$fields$\n                                    fieldCount:$fields_count$\n                                   storageSize:sizeof($classname$__storage_)\n                                         flags:$init_flags$];\n"
                      );
    pDVar12 = extraout_RDX;
    if ((this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      io::Printer::Print(printer,"    static const char *oneofs[] = {\n");
      for (ppOVar14 = (this->oneof_generators_).
                      super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppOVar14 !=
          (this->oneof_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppOVar14 = ppOVar14 + 1) {
        OneofGenerator::DescriptorName_abi_cxx11_(&suffix_added,*ppOVar14);
        io::Printer::Print(printer,"      \"$name$\",\n","name",&suffix_added);
        std::__cxx11::string::~string((string *)&suffix_added);
      }
      OneofGenerator::HasIndexAsString_abi_cxx11_
                (&suffix_added,
                 *(this->oneof_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      io::Printer::Print(printer,
                         "    };\n    [localDescriptor setupOneofs:oneofs\n                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n                   firstHasIndex:$first_has_index$];\n"
                         ,"first_has_index",&suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
      pDVar12 = extraout_RDX_00;
    }
    if (text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      TextFormatDecodeData::Data_abi_cxx11_(&suffix_added,&text_format_decode_data);
      io::Printer::Print(printer,
                         "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n    static const char *extraTextFormatInfo ="
                        );
      for (uVar9 = 0; uVar9 < suffix_added._M_string_length; uVar9 = uVar9 + 0x28) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&suffix_added);
        CEscape(&local_b0,&local_70);
        EscapeTrigraphs(&local_168,&local_b0);
        io::Printer::Print(printer,"\n        \"$data$\"","data",&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
      }
      io::Printer::Print(printer,
                         ";\n    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
                        );
      std::__cxx11::string::~string((string *)&suffix_added);
      pDVar12 = extraout_RDX_01;
    }
    if (sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        sorted_extensions.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      io::Printer::Print(printer,"    static const GPBExtensionRange ranges[] = {\n");
      uVar11 = extraout_RDX_02;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
      {
        SimpleItoa_abi_cxx11_
                  (&suffix_added,
                   (protobuf *)
                   (ulong)(uint)sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9]->start,(int)uVar11)
        ;
        SimpleItoa_abi_cxx11_
                  (&local_168,
                   (protobuf *)
                   (ulong)(uint)sorted_extensions.
                                super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9]->end,i_00);
        io::Printer::Print(printer,"      { .start = $start$, .end = $end$ },\n","start",
                           &suffix_added,"end",&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&suffix_added);
        uVar11 = extraout_RDX_03;
      }
      io::Printer::Print(printer,
                         "    };\n    [localDescriptor setupExtensionRanges:ranges\n                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n"
                        );
      pDVar12 = extraout_RDX_04;
    }
    descriptor = this->descriptor_;
    if (*(objectivec **)(descriptor + 0x18) != (objectivec *)0x0) {
      ClassName_abi_cxx11_(&suffix_added,*(objectivec **)(descriptor + 0x18),pDVar12);
      io::Printer::Print(printer,
                         "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n"
                         ,"parent_name",&suffix_added);
      std::__cxx11::string::~string((string *)&suffix_added);
      descriptor = this->descriptor_;
    }
    suffix_added._M_dataplus._M_p = (pointer)&suffix_added.field_2;
    suffix_added._M_string_length = 0;
    suffix_added.field_2._M_local_buf[0] = '\0';
    ClassName(&local_50,descriptor,&suffix_added);
    std::__cxx11::string::~string((string *)&local_50);
    if (suffix_added._M_string_length != 0) {
      io::Printer::Print(printer,
                         "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
                         "suffix",&suffix_added);
    }
    io::Printer::Print(printer,
                       "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n    descriptor = localDescriptor;\n  }\n  return descriptor;\n}\n\n@end\n\n"
                      );
    if ((this->deprecated_attribute_)._M_string_length != 0) {
      io::Printer::Print(printer,"#pragma clang diagnostic pop\n\n");
    }
    lVar17 = 0;
    for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x2c); lVar15 = lVar15 + 1) {
      pFVar6 = FieldGeneratorMap::get
                         (this_00,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar17))
      ;
      (*pFVar6->_vptr_FieldGenerator[6])(pFVar6,printer);
      lVar17 = lVar17 + 0xa8;
    }
    for (ppOVar14 = (this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppOVar14 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppOVar14 = ppOVar14 + 1) {
      OneofGenerator::GenerateClearFunctionImplementation(*ppOVar14,printer);
    }
    std::__cxx11::string::~string((string *)&suffix_added);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&init_flags);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    std::__cxx11::string::~string((string *)&field_description_type);
    TextFormatDecodeData::~TextFormatDecodeData(&text_format_decode_data);
    std::
    _Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::~_Vector_base(&sorted_extensions.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   );
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
              (&size_order_fields);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&sorted_fields)
    ;
  }
  for (ppEVar18 = (this->enum_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppEVar18 !=
      (this->enum_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppEVar18 = ppEVar18 + 1) {
    EnumGenerator::GenerateSource(*ppEVar18,printer);
  }
  for (ppMVar19 = (this->nested_message_generators_).
                  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppMVar19 !=
      (this->nested_message_generators_).
      super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppMVar19 = ppMVar19 + 1) {
    GenerateSource(*ppMVar19,printer);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSource(io::Printer* printer) {
  if (!IsMapEntryMessage(descriptor_)) {
    printer->Print(
        "#pragma mark - $classname$\n"
        "\n",
        "classname", class_name_);

    if (!deprecated_attribute_.empty()) {
      // No warnings when compiling the impl of this deprecated class.
      printer->Print(
          "#pragma clang diagnostic push\n"
          "#pragma clang diagnostic ignored \"-Wdeprecated-implementations\"\n"
          "\n");
    }

    printer->Print("@implementation $classname$\n\n",
                   "classname", class_name_);

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GeneratePropertyImplementation(printer);
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GeneratePropertyImplementation(printer);
    }

    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));
    scoped_array<const FieldDescriptor*> size_order_fields(
        SortFieldsByStorageSize(descriptor_));

    vector<const Descriptor::ExtensionRange*> sorted_extensions;
    for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
      sorted_extensions.push_back(descriptor_->extension_range(i));
    }

    sort(sorted_extensions.begin(), sorted_extensions.end(),
         ExtensionRangeOrdering());

    // Assign has bits:
    // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
    //    who needs has bits and assigning them.
    // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
    //    index that groups all the elements in the oneof.
    size_t num_has_bits = field_generators_.CalculateHasBits();
    size_t sizeof_has_storage = (num_has_bits + 31) / 32;
    if (sizeof_has_storage == 0) {
      // In the case where no field needs has bits, don't let the _has_storage_
      // end up as zero length (zero length arrays are sort of a grey area
      // since it has to be at the start of the struct). This also ensures a
      // field with only oneofs keeps the required negative indices they need.
      sizeof_has_storage = 1;
    }
    // Tell all the fields the oneof base.
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->SetOneofIndexBase(sizeof_has_storage);
    }
    field_generators_.SetOneofIndexBase(sizeof_has_storage);
    // sizeof_has_storage needs enough bits for the single fields that aren't in
    // any oneof, and then one int32 for each oneof (to store the field number).
    sizeof_has_storage += descriptor_->oneof_decl_count();

    printer->Print(
        "\n"
        "typedef struct $classname$__storage_ {\n"
        "  uint32_t _has_storage_[$sizeof_has_storage$];\n",
        "classname", class_name_,
        "sizeof_has_storage", SimpleItoa(sizeof_has_storage));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(size_order_fields[i])
          .GenerateFieldStorageDeclaration(printer);
    }
    printer->Outdent();

    printer->Print("} $classname$__storage_;\n\n", "classname", class_name_);


    printer->Print(
        "// This method is threadsafe because it is initially called\n"
        "// in +initialize for each subclass.\n"
        "+ (GPBDescriptor *)descriptor {\n"
        "  static GPBDescriptor *descriptor = nil;\n"
        "  if (!descriptor) {\n");

    TextFormatDecodeData text_format_decode_data;
    bool has_fields = descriptor_->field_count() > 0;
    bool need_defaults = field_generators_.DoesAnyFieldHaveNonZeroDefault();
    string field_description_type;
    if (need_defaults) {
      field_description_type = "GPBMessageFieldDescriptionWithDefault";
    } else {
      field_description_type = "GPBMessageFieldDescription";
    }
    if (has_fields) {
      printer->Print(
          "    static $field_description_type$ fields[] = {\n",
          "field_description_type", field_description_type);
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        const FieldGenerator& field_generator =
            field_generators_.get(sorted_fields[i]);
        field_generator.GenerateFieldDescription(printer, need_defaults);
        if (field_generator.needs_textformat_name_support()) {
          text_format_decode_data.AddString(sorted_fields[i]->number(),
                                            field_generator.generated_objc_name(),
                                            field_generator.raw_field_name());
        }
      }
      printer->Outdent();
      printer->Outdent();
      printer->Outdent();
      printer->Print(
          "    };\n");
    }

    map<string, string> vars;
    vars["classname"] = class_name_;
    vars["rootclassname"] = root_classname_;
    vars["fields"] = has_fields ? "fields" : "NULL";
    if (has_fields) {
      vars["fields_count"] =
          "(uint32_t)(sizeof(fields) / sizeof(" + field_description_type + "))";
    } else {
      vars["fields_count"] = "0";
    }

    std::vector<string> init_flags;
    if (need_defaults) {
      init_flags.push_back("GPBDescriptorInitializationFlag_FieldsWithDefault");
    }
    if (descriptor_->options().message_set_wire_format()) {
      init_flags.push_back("GPBDescriptorInitializationFlag_WireFormat");
    }
    vars["init_flags"] = BuildFlagsString(FLAGTYPE_DESCRIPTOR_INITIALIZATION,
                                          init_flags);

    printer->Print(
        vars,
        "    GPBDescriptor *localDescriptor =\n"
        "        [GPBDescriptor allocDescriptorForClass:[$classname$ class]\n"
        "                                     rootClass:[$rootclassname$ class]\n"
        "                                          file:$rootclassname$_FileDescriptor()\n"
        "                                        fields:$fields$\n"
        "                                    fieldCount:$fields_count$\n"
        "                                   storageSize:sizeof($classname$__storage_)\n"
        "                                         flags:$init_flags$];\n");
    if (oneof_generators_.size() != 0) {
      printer->Print(
          "    static const char *oneofs[] = {\n");
      for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
           iter != oneof_generators_.end(); ++iter) {
        printer->Print(
            "      \"$name$\",\n",
            "name", (*iter)->DescriptorName());
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupOneofs:oneofs\n"
          "                           count:(uint32_t)(sizeof(oneofs) / sizeof(char*))\n"
          "                   firstHasIndex:$first_has_index$];\n",
          "first_has_index", oneof_generators_[0]->HasIndexAsString());
    }
    if (text_format_decode_data.num_entries() != 0) {
      const string text_format_data_str(text_format_decode_data.Data());
      printer->Print(
          "#if !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n"
          "    static const char *extraTextFormatInfo =");
      static const int kBytesPerLine = 40;  // allow for escaping
      for (int i = 0; i < text_format_data_str.size(); i += kBytesPerLine) {
        printer->Print(
            "\n        \"$data$\"",
            "data", EscapeTrigraphs(
                CEscape(text_format_data_str.substr(i, kBytesPerLine))));
      }
      printer->Print(
          ";\n"
          "    [localDescriptor setupExtraTextInfo:extraTextFormatInfo];\n"
          "#endif  // !GPBOBJC_SKIP_MESSAGE_TEXTFORMAT_EXTRAS\n");
    }
    if (sorted_extensions.size() != 0) {
      printer->Print(
          "    static const GPBExtensionRange ranges[] = {\n");
      for (int i = 0; i < sorted_extensions.size(); i++) {
        printer->Print("      { .start = $start$, .end = $end$ },\n",
                       "start", SimpleItoa(sorted_extensions[i]->start),
                       "end", SimpleItoa(sorted_extensions[i]->end));
      }
      printer->Print(
          "    };\n"
          "    [localDescriptor setupExtensionRanges:ranges\n"
          "                                    count:(uint32_t)(sizeof(ranges) / sizeof(GPBExtensionRange))];\n");
    }
    if (descriptor_->containing_type() != NULL) {
      string parent_class_name = ClassName(descriptor_->containing_type());
      printer->Print(
          "    [localDescriptor setupContainingMessageClassName:GPBStringifySymbol($parent_name$)];\n",
          "parent_name", parent_class_name);
    }
    string suffix_added;
    ClassName(descriptor_, &suffix_added);
    if (suffix_added.size() > 0) {
      printer->Print(
          "    [localDescriptor setupMessageClassNameSuffix:@\"$suffix$\"];\n",
          "suffix", suffix_added);
    }
    printer->Print(
        "    NSAssert(descriptor == nil, @\"Startup recursed!\");\n"
        "    descriptor = localDescriptor;\n"
        "  }\n"
        "  return descriptor;\n"
        "}\n\n"
        "@end\n\n");

    if (!deprecated_attribute_.empty()) {
      printer->Print(
          "#pragma clang diagnostic pop\n"
          "\n");
    }

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(descriptor_->field(i))
          .GenerateCFunctionImplementations(printer);
    }

    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionImplementation(printer);
    }
  }

  for (vector<EnumGenerator*>::iterator iter = enum_generators_.begin();
       iter != enum_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateSource(printer);
  }
}